

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x86_64.c
# Opt level: O0

void BYTE_OUT1R(dill_stream s,int rex,int insn1)

{
  byte *pbVar1;
  undefined4 in_EDX;
  int in_ESI;
  long in_RDI;
  uchar *tmp_ip;
  
  if (*(ulong *)(*(long *)(in_RDI + 8) + 0x10) <= *(ulong *)(*(long *)(in_RDI + 8) + 8)) {
    extend_dill_stream((dill_stream_conflict)tmp_ip);
  }
  pbVar1 = *(byte **)(*(long *)(in_RDI + 8) + 8);
  if (in_ESI == 0) {
    *pbVar1 = (byte)in_EDX;
  }
  else {
    *pbVar1 = (byte)in_ESI | 0x40;
    pbVar1[1] = (byte)in_EDX;
  }
  if (*(int *)(in_RDI + 0x18) != 0) {
    dump_cur_dill_insn((dill_stream_conflict)CONCAT44(in_ESI,in_EDX));
  }
  *(long *)(*(long *)(in_RDI + 8) + 8) = *(long *)(*(long *)(in_RDI + 8) + 8) + 1;
  if (in_ESI != 0) {
    *(long *)(*(long *)(in_RDI + 8) + 8) = *(long *)(*(long *)(in_RDI + 8) + 8) + 1;
  }
  return;
}

Assistant:

static void
BYTE_OUT1R(dill_stream s, int rex, int insn1)
{
    unsigned char* tmp_ip;
    if (s->p->cur_ip >= s->p->code_limit) {
        extend_dill_stream(s);
    }
    tmp_ip = (unsigned char*)s->p->cur_ip;
    if (rex != 0) {
        *tmp_ip = (unsigned char)rex | 0x40;
        *(tmp_ip + 1) = (unsigned char)insn1;
    } else {
        *(tmp_ip) = (unsigned char)insn1;
    }
    if (s->dill_debug)
        dump_cur_dill_insn(s);
    s->p->cur_ip = ((char*)s->p->cur_ip) + 1;
    if (rex != 0)
        s->p->cur_ip++;
}